

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemapping.cpp
# Opt level: O2

bool __thiscall myutils::FileMapping::open_file(FileMapping *this,string *filename,bool read_only)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  stat st;
  
  std::__cxx11::string::_M_assign((string *)&this->m_id);
  iVar1 = stat((filename->_M_dataplus)._M_p,(stat *)&st);
  if ((iVar1 == 0) && (st.st_size != 0)) {
    bVar3 = !read_only;
    iVar1 = open((filename->_M_dataplus)._M_p,(uint)bVar3 + (uint)bVar3);
    if (iVar1 == -1) {
      return false;
    }
    pcVar2 = (char *)mmap((void *)0x0,st.st_size,(uint)bVar3 * 2 + 1,1,iVar1,0);
    if (pcVar2 != (char *)0xffffffffffffffff) {
      this->m_pMapAddress = pcVar2;
      if (st.st_size < 0xffffffff) {
        this->m_fd = iVar1;
        this->m_filesize = (uint32_t)st.st_size;
        return true;
      }
      __assert_fail("st.st_size < UINT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/filemapping.cpp"
                    ,0x14d,"bool myutils::FileMapping::open_file(const string &, bool)");
    }
    ::close(iVar1);
  }
  return false;
}

Assistant:

bool FileMapping::open_file(const string& filename, bool read_only)
{
    m_id = filename;
    struct stat st;
    if (stat(filename.c_str(), &st)) {
        // LOG(ERROR) <<"Can't stat " << filename <<", error=" << strerror(errno);
        return false;     
    }
    if (st.st_size == 0) {
        // LOG(ERROR) <<"Wrong file size " << filename <<", size=" << st.st_size;
        return false;
    }

    int flag = read_only? O_RDONLY : O_RDWR;
    int fd = ::open(filename.c_str(), flag);
    if ( fd == -1) {
        // LOG(ERROR) <<"Can't open " << filename <<", error=" << strerror(errno);
        return false;
    }

    int prot = read_only ? PROT_READ : (PROT_READ|PROT_WRITE);
    char * p  = (char*)mmap(nullptr, st.st_size, prot, MAP_SHARED, fd, 0);
    if (p != MAP_FAILED) {
        m_pMapAddress = p;
        assert(st.st_size < UINT32_MAX);// << "Only support 4G memory file";
        m_fd = fd;
        m_filesize = static_cast<uint32_t>(st.st_size);
        return true;
    } else {
        ::close(fd);
        return false;
    }
}